

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::getModifyIntensityApertureDiff_abi_cxx11_
          (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,Station *this,int aperture,double size)

{
  double dVar1;
  int iVar2;
  long lVar3;
  mapped_type *pmVar4;
  long lVar5;
  ulong uVar6;
  mapped_type mVar7;
  double dVar8;
  double local_50;
  value_type local_48;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *local_38;
  
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node._M_size = 0;
  dVar1 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[aperture];
  if (0.0 <= dVar1 + size) {
    dVar8 = (double)this->max_intensity;
    local_50 = size;
    if (dVar8 < dVar1 + size) {
      if (dVar8 <= dVar1) {
        return __return_storage_ptr__;
      }
      local_50 = dVar8 - dVar1;
    }
  }
  else {
    local_50 = dVar1;
    if (dVar1 <= 0.0) {
      return __return_storage_ptr__;
    }
  }
  local_38 = &this->pos2beam;
  for (uVar6 = 0; iVar2 = Collimator::getXdim(this->collimator), (long)uVar6 < (long)iVar2;
      uVar6 = uVar6 + 1) {
    lVar5 = *(long *)&(this->A).
                      super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[aperture].
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data;
    lVar3 = (long)*(int *)(lVar5 + uVar6 * 8);
    if ((-1 < lVar3) && (-1 < *(int *)(lVar5 + 4 + uVar6 * 8))) {
      local_48._0_8_ = lVar3 << 0x20 | uVar6;
      pmVar4 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](local_38,(key_type *)&local_48);
      mVar7 = *pmVar4;
      lVar5 = *(long *)&(this->A).
                        super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[aperture].
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data;
      for (iVar2 = *(int *)(lVar5 + uVar6 * 8); iVar2 <= *(int *)(lVar5 + 4 + uVar6 * 8);
          iVar2 = iVar2 + 1) {
        local_48.first = mVar7;
        local_48.second = local_50;
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        push_back(__return_storage_ptr__,&local_48);
        mVar7 = mVar7 + 1;
        lVar5 = *(long *)&(this->A).
                          super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[aperture].
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

list <pair< int,double> > Station::getModifyIntensityApertureDiff (int aperture, double size) {
    list < pair <int, double > > diff;
    if ((intensity[aperture]+size) < 0 || (intensity[aperture]+size) > max_intensity) {
      if (intensity[aperture]+size < 0) {
        // Too low intensity
        if (intensity[aperture]>0)
          size = intensity[aperture];
        else
          return(diff);
      } else if ((intensity[aperture]+size) > max_intensity) {
        // Too high intensity
        if (intensity[aperture] < max_intensity)
          size = max_intensity - intensity[aperture];
        else 
          return(diff);
      } else {
        return (diff);
      }
    }
    for (int i=0; i<collimator.getXdim(); i++) {
      if (A[aperture][i].first<0 || A[aperture][i].second<0) 
        continue;
      int beamlet = pos2beam[make_pair(i, A[aperture][i].first)];
      for(int j=A[aperture][i].first; j<=A[aperture][i].second; j++){
        diff.push_back(make_pair(beamlet, size));
        beamlet++;
      }
    }
    return(diff);
    
  }